

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_outbound.hpp
# Opt level: O0

ostream * std::operator<<(ostream *os,
                         pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *pr)

{
  ostream *poVar1;
  string *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,in_RSI);
  poVar1 = std::operator<<(poVar1,":");
  std::operator<<(poVar1,in_RSI + 0x20);
  return in_RDI;
}

Assistant:

ostream& operator << (ostream& os, const pair<T1, T2>& pr)
        {
            os << pr.first << ":" << pr.second ;
            return os;
        }